

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::JsonCodec::decode(JsonCodec *this,Reader input,Builder output)

{
  HandlerBase *pHVar1;
  Reader input_00;
  Builder builder;
  Builder output_00;
  Impl *pIVar2;
  undefined8 in_stack_fffffffffffffe78;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined1 local_100 [8];
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  Orphanage local_d0;
  StructSchema local_c0;
  undefined8 local_b8 [6];
  undefined1 local_88 [48];
  undefined1 local_58 [48];
  Maybe<capnp::JsonCodec::HandlerBase_*const_&> local_28;
  HandlerBase **local_20;
  HandlerBase **handler;
  StructSchema type;
  JsonCodec *this_local;
  
  type.super_Schema.raw = (Schema)(Schema)this;
  handler = (HandlerBase **)DynamicStruct::Builder::getSchema(&output);
  pIVar2 = kj::Own<capnp::JsonCodec::Impl>::operator->(&this->impl);
  local_28 = kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::find<capnp::StructSchema&>
                       ((HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*> *)&pIVar2->typeHandlers
                        ,(StructSchema *)&handler);
  local_20 = kj::_::readMaybe<capnp::JsonCodec::HandlerBase*const>(&local_28);
  if (local_20 == (HandlerBase **)0x0) {
    memcpy(local_b8,&input,0x30);
    local_c0.super_Schema.raw = (Schema)(Schema)handler;
    memcpy(local_100,&output,0x30);
    builder.builder.segment._0_4_ = (int)local_f0;
    builder.schema.super_Schema.raw = (Schema)(Schema)uStack_f8;
    builder.builder.segment._4_4_ = (int)((ulong)local_f0 >> 0x20);
    builder.builder.capTable._0_4_ = (int)uStack_e8;
    builder.builder.capTable._4_4_ = (int)((ulong)uStack_e8 >> 0x20);
    builder.builder.data._0_4_ = (int)local_e0;
    builder.builder.data._4_4_ = (int)((ulong)local_e0 >> 0x20);
    builder.builder.pointers._0_4_ = (int)uStack_d8;
    builder.builder.pointers._4_4_ = (int)((ulong)uStack_d8 >> 0x20);
    builder.builder.dataSize = (int)in_stack_fffffffffffffe78;
    builder.builder.pointerCount = (short)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    builder.builder._38_2_ = (short)((ulong)in_stack_fffffffffffffe78 >> 0x30);
    local_d0 = Orphanage::getForMessageContaining<capnp::DynamicStruct::Builder>(builder);
    memcpy(&local_130,&output,0x30);
    input_00._reader.capTable._0_4_ = (int)local_b8[1];
    input_00._reader.segment = (SegmentReader *)local_b8[0];
    input_00._reader.capTable._4_4_ = (int)((ulong)local_b8[1] >> 0x20);
    input_00._reader.data._0_4_ = (int)local_b8[2];
    input_00._reader.data._4_4_ = (int)((ulong)local_b8[2] >> 0x20);
    input_00._reader.pointers._0_4_ = (int)local_b8[3];
    input_00._reader.pointers._4_4_ = (int)((ulong)local_b8[3] >> 0x20);
    input_00._reader.dataSize = (int)local_b8[4];
    input_00._reader._36_4_ = (int)((ulong)local_b8[4] >> 0x20);
    input_00._reader.nestingLimit = (int)local_b8[5];
    input_00._reader._44_4_ = (int)((ulong)local_b8[5] >> 0x20);
    output_00.builder.segment = (SegmentBuilder *)uStack_128;
    output_00.schema.super_Schema.raw = (Schema)(Schema)local_130;
    output_00.builder.capTable = (CapTableBuilder *)local_120;
    output_00.builder.data = (void *)uStack_118;
    output_00.builder.pointers = (WirePointer *)local_110;
    output_00.builder.dataSize = (undefined4)uStack_108;
    output_00.builder.pointerCount = uStack_108._4_2_;
    output_00.builder._38_2_ = uStack_108._6_2_;
    decodeObject(this,input_00,local_c0,local_d0,output_00);
  }
  else {
    pHVar1 = *local_20;
    memcpy(local_58,&input,0x30);
    memcpy(local_88,&output,0x30);
    (*pHVar1->_vptr_HandlerBase[2])(pHVar1,this);
  }
  return;
}

Assistant:

void JsonCodec::decode(JsonValue::Reader input, DynamicStruct::Builder output) const {
  auto type = output.getSchema();

  KJ_IF_MAYBE(handler, impl->typeHandlers.find(type)) {
    return (*handler)->decodeStructBase(*this, input, output);
  }

  decodeObject(input, type, Orphanage::getForMessageContaining(output), output);
}